

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfadjointProduct.h
# Opt level: O0

void Eigen::
     selfadjoint_product_selector<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_false>
     ::run(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *mat,
          Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *other,Scalar *alpha)

{
  PointerType pdVar1;
  Index depth_00;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *pBVar2;
  Index rows;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  ScalarWithConstIfNotLvalue *_res;
  Index resStride;
  Scalar SVar3;
  undefined1 local_80 [8];
  BlockingType blocking;
  Index depth;
  Index size;
  Scalar actualAlpha;
  type actualOther;
  Scalar *alpha_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *other_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *mat_local;
  
  actualOther = (type)alpha;
  alpha_local = (Scalar *)other;
  other_local = mat;
  pBVar2 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
           derived((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)other);
  actualAlpha = (Scalar)internal::
                        blas_traits<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                        ::extract(pBVar2);
  pdVar1 = (actualOther->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data;
  pBVar2 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
           derived((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)alpha_local);
  SVar3 = internal::
          blas_traits<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
          extractScalarFactor(pBVar2);
  size = (Index)((double)pdVar1 * SVar3);
  rows = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)other_local);
  blocking.m_sizeB =
       MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                 ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   *)actualAlpha);
  internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)local_80,rows,rows,
             blocking.m_sizeB,1,false);
  depth_00 = blocking.m_sizeB;
  _lhs = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)actualAlpha,0,0);
  lhsStride = internal::
              BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           *)actualAlpha);
  _rhs = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)actualAlpha,0,0);
  rhsStride = internal::
              BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           *)actualAlpha);
  _res = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>::data
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     *)other_local);
  resStride = internal::
              BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           *)other_local);
  internal::
  general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::run
            (rows,depth_00,_lhs,lhsStride,_rhs,rhsStride,_res,resStride,(ResScalar *)&size,
             (level3_blocking<double,_double> *)local_80);
  internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)local_80);
  return;
}

Assistant:

static void run(MatrixType& mat, const OtherType& other, const typename MatrixType::Scalar& alpha)
  {
    typedef typename MatrixType::Scalar Scalar;
    typedef internal::blas_traits<OtherType> OtherBlasTraits;
    typedef typename OtherBlasTraits::DirectLinearAccessType ActualOtherType;
    typedef typename internal::remove_all<ActualOtherType>::type _ActualOtherType;
    typename internal::add_const_on_value_type<ActualOtherType>::type actualOther = OtherBlasTraits::extract(other.derived());

    Scalar actualAlpha = alpha * OtherBlasTraits::extractScalarFactor(other.derived());

    enum {
      IsRowMajor = (internal::traits<MatrixType>::Flags&RowMajorBit) ? 1 : 0,
      OtherIsRowMajor = _ActualOtherType::Flags&RowMajorBit ? 1 : 0
    };

    Index size = mat.cols();
    Index depth = actualOther.cols();

    typedef internal::gemm_blocking_space<IsRowMajor ? RowMajor : ColMajor,Scalar,Scalar,
              MatrixType::MaxColsAtCompileTime, MatrixType::MaxColsAtCompileTime, _ActualOtherType::MaxColsAtCompileTime> BlockingType;

    BlockingType blocking(size, size, depth, 1, false);


    internal::general_matrix_matrix_triangular_product<Index,
      Scalar, OtherIsRowMajor ? RowMajor : ColMajor,   OtherBlasTraits::NeedToConjugate  && NumTraits<Scalar>::IsComplex,
      Scalar, OtherIsRowMajor ? ColMajor : RowMajor, (!OtherBlasTraits::NeedToConjugate) && NumTraits<Scalar>::IsComplex,
      IsRowMajor ? RowMajor : ColMajor, UpLo>
      ::run(size, depth,
            &actualOther.coeffRef(0,0), actualOther.outerStride(), &actualOther.coeffRef(0,0), actualOther.outerStride(),
            mat.data(), mat.outerStride(), actualAlpha, blocking);
  }